

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

size_t wwNAF(word *naf,word *a,size_t n,size_t w)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  word mask;
  
  bVar5 = (byte)w;
  uVar9 = 1L << (bVar5 & 0x3f);
  sVar1 = wwBitSize(a,n);
  memset(naf,0,n << 4 | 8);
  if (n != 0) {
    uVar2 = uVar9 >> 1;
    lVar7 = n - 1;
    uVar3 = 0;
    do {
      uVar3 = uVar3 | a[lVar7];
      bVar11 = lVar7 != 0;
      lVar7 = lVar7 + -1;
    } while (bVar11);
    if (uVar3 != 0) {
      uVar3 = ~(-1L << (bVar5 & 0x3f));
      if (0x3f < w) {
        uVar3 = 0xffffffffffffffff;
      }
      uVar3 = uVar3 & *a;
      bVar11 = w < sVar1;
      if (uVar3 != 0 || w < sVar1) {
        uVar6 = 0xffffffffffffffff >> (-bVar5 & 0x3f);
        if (0x3f < w) {
          uVar6 = 0xffffffffffffffff;
        }
        sVar10 = 0;
        lVar7 = 0;
        do {
          if ((uVar3 & 1) == 0) {
            lVar8 = lVar7 + 1;
            wwShHi(naf,lVar7 + 0x40U >> 6,1);
            uVar4 = uVar3;
          }
          else {
            if ((uVar2 & uVar3) == 0) {
              uVar4 = 0;
            }
            else if (bVar11) {
              uVar3 = -uVar3 & uVar2 - 1 ^ uVar2;
              uVar4 = uVar9;
            }
            else {
              uVar3 = uVar3 & uVar2 - 1;
              uVar4 = uVar2;
            }
            lVar8 = lVar7 + w;
            wwShHi(naf,w + lVar7 + 0x3f >> 6,w);
            *naf = uVar3 & uVar6 | *naf & ~uVar6;
          }
          uVar3 = uVar4 >> 1;
          if (bVar11) {
            uVar4 = uVar2;
            if ((a[w + sVar10 >> 6] >> (w + sVar10 & 0x3f) & 1) == 0) {
              uVar4 = 0;
            }
            uVar3 = uVar3 + uVar4;
          }
          bVar11 = w + 1 + sVar10 < sVar1;
          sVar10 = sVar10 + 1;
          lVar7 = lVar8;
        } while (uVar3 != 0 || bVar11);
        return sVar10;
      }
    }
  }
  return 0;
}

Assistant:

size_t wwNAF(word naf[], const word a[], size_t n, size_t w)
{
	const word next_bit = WORD_BIT_POS(w);
	const word hi_bit = next_bit >> 1;
	const word mask = hi_bit - 1;
	register word window;
	register word digit;
	register size_t naf_len = 0;
	register size_t naf_size = 0;
	register size_t a_len = wwBitSize(a, n);
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, n, naf, 2 * n + 1));
	ASSERT(2 <= w && w < B_PER_W);
	// naf <- 0
	wwSetZero(naf, 2 * n + 1);
	// a == 0?
	if (wwIsZero(a, n))
		return 0;
	// window <- a mod 2^w
	window = wwGetBits(a, 0, w);
	// расчет NAF
	for (i = w; window || i < a_len; ++i)
	{
		// ненулевой символ?
		if (window & 1)
		{
			// кодирование отрицательного символа
			if (window & hi_bit)
			{
				// модифицировать отрицательный символ суффикса NAF...
				if (i >= a_len)
					// ...сделать его положительным
					digit = window & mask,
					// window <- window - digit
					window = hi_bit;
				else
					// digit <- |window|
					digit = (0 - window) & mask,
					// digit <- 1||digit
					digit ^= hi_bit,
					// window <- window - digit
					window = next_bit;
			}
			else
				// кодирование положительного символа
				digit = window,
				// window <- window - digit
				window = 0;
			// запись ненулевого символа
			wwShHi(naf, W_OF_B(naf_len + w), w);
			wwSetBits(naf, 0, w, digit);
			naf_len += w;
		}
		else
			// кодирование нулевого символа
			wwShHi(naf, W_OF_B(++naf_len), 1);
		// увеличить размер naf
		++naf_size;
		// сдвиг окна
		window >>= 1;
		if (i < a_len)
			window += hi_bit * wwTestBit(a, i);
	}
	digit = window = 0;
	naf_len = a_len = 0;
	return naf_size;
}